

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slaqgs.c
# Opt level: O3

void slaqgs(SuperMatrix *A,float *r,float *c,float rowcnd,float colcnd,float amax,char *equed)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  long lVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  char cVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  
  cVar8 = 'N';
  if ((0 < A->nrow) && (0 < A->ncol)) {
    pvVar3 = A->Store;
    lVar4 = *(long *)((long)pvVar3 + 8);
    fVar12 = smach("Safe minimum");
    fVar13 = smach("Precision");
    if ((rowcnd < 0.1) || ((amax < fVar12 / fVar13 || (1.0 / (fVar12 / fVar13) < amax)))) {
      uVar2 = A->ncol;
      if (0.1 <= colcnd) {
        cVar8 = 'R';
        if (0 < (int)uVar2) {
          piVar5 = *(int **)((long)pvVar3 + 0x18);
          uVar10 = 0;
          iVar7 = *piVar5;
          do {
            iVar6 = piVar5[uVar10 + 1];
            if (iVar7 < iVar6) {
              lVar9 = *(long *)((long)pvVar3 + 0x10);
              lVar11 = (long)iVar7;
              do {
                *(float *)(lVar4 + lVar11 * 4) =
                     r[*(int *)(lVar9 + lVar11 * 4)] * *(float *)(lVar4 + lVar11 * 4);
                lVar11 = lVar11 + 1;
              } while (iVar6 != lVar11);
            }
            uVar10 = uVar10 + 1;
            iVar7 = iVar6;
          } while (uVar10 != uVar2);
        }
      }
      else {
        cVar8 = 'B';
        if (0 < (int)uVar2) {
          piVar5 = *(int **)((long)pvVar3 + 0x18);
          uVar10 = 0;
          iVar7 = *piVar5;
          do {
            iVar6 = piVar5[uVar10 + 1];
            if (iVar7 < iVar6) {
              fVar12 = c[uVar10];
              lVar9 = *(long *)((long)pvVar3 + 0x10);
              lVar11 = (long)iVar7;
              do {
                *(float *)(lVar4 + lVar11 * 4) =
                     r[*(int *)(lVar9 + lVar11 * 4)] * fVar12 * *(float *)(lVar4 + lVar11 * 4);
                lVar11 = lVar11 + 1;
              } while (iVar6 != lVar11);
            }
            uVar10 = uVar10 + 1;
            iVar7 = iVar6;
          } while (uVar10 != uVar2);
        }
      }
    }
    else if (colcnd < 0.1) {
      iVar7 = A->ncol;
      cVar8 = 'C';
      if (0 < (long)iVar7) {
        piVar5 = *(int **)((long)pvVar3 + 0x18);
        lVar9 = 0;
        iVar6 = *piVar5;
        do {
          iVar1 = piVar5[lVar9 + 1];
          if (iVar6 < iVar1) {
            fVar12 = c[lVar9];
            lVar11 = (long)iVar6;
            do {
              *(float *)(lVar4 + lVar11 * 4) = *(float *)(lVar4 + lVar11 * 4) * fVar12;
              lVar11 = lVar11 + 1;
            } while (iVar1 != lVar11);
          }
          lVar9 = lVar9 + 1;
          iVar6 = iVar1;
        } while (lVar9 != iVar7);
      }
    }
  }
  *equed = cVar8;
  return;
}

Assistant:

void
slaqgs(SuperMatrix *A, float *r, float *c, 
	float rowcnd, float colcnd, float amax, char *equed)
{


#define THRESH    (0.1)
    
    /* Local variables */
    NCformat *Astore;
    float   *Aval;
    int_t i, j;
    int   irow;
    float large, small, cj;


    /* Quick return if possible */
    if (A->nrow <= 0 || A->ncol <= 0) {
	*(unsigned char *)equed = 'N';
	return;
    }

    Astore = A->Store;
    Aval = Astore->nzval;
    
    /* Initialize LARGE and SMALL. */
    small = smach("Safe minimum") / smach("Precision");
    large = 1. / small;

    if (rowcnd >= THRESH && amax >= small && amax <= large) {
	if (colcnd >= THRESH)
	    *(unsigned char *)equed = 'N';
	else {
	    /* Column scaling */
	    for (j = 0; j < A->ncol; ++j) {
		cj = c[j];
		for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		    Aval[i] *= cj;
                }
	    }
	    *(unsigned char *)equed = 'C';
	}
    } else if (colcnd >= THRESH) {
	/* Row scaling, no column scaling */
	for (j = 0; j < A->ncol; ++j)
	    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		irow = Astore->rowind[i];
		Aval[i] *= r[irow];
	    }
	*(unsigned char *)equed = 'R';
    } else {
	/* Row and column scaling */
	for (j = 0; j < A->ncol; ++j) {
	    cj = c[j];
	    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		irow = Astore->rowind[i];
		Aval[i] *= cj * r[irow];
	    }
	}
	*(unsigned char *)equed = 'B';
    }

    return;

}